

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_ssim.cpp
# Opt level: O0

void basisu::add_image(imagef *src1,imagef *src2,imagef *dst)

{
  uint32_t uVar1;
  imagef *in_RDX;
  vec4F *s2;
  vec4F *s1;
  uint32_t x;
  int y;
  float in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  float in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  float in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  imagef *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 local_30;
  undefined4 local_2c;
  
  vec<4U,_float>::vec((vec<4U,_float> *)
                      CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,0.0,7.57622e-39);
  imagef::resize((imagef *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (imagef *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (uint32_t)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                 (vec4F *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_2c = 0;
  while( true ) {
    uVar1 = imagef::get_height(in_RDX);
    if ((int)uVar1 <= local_2c) break;
    local_30 = 0;
    while( true ) {
      uVar1 = imagef::get_width(in_RDX);
      if (uVar1 <= local_30) break;
      imagef::operator()(in_stack_ffffffffffffff90,(uint32_t)in_stack_ffffffffffffff8c,
                         (uint32_t)in_stack_ffffffffffffff88);
      imagef::operator()(in_stack_ffffffffffffff90,(uint32_t)in_stack_ffffffffffffff8c,
                         (uint32_t)in_stack_ffffffffffffff88);
      in_stack_ffffffffffffff90 =
           (imagef *)
           imagef::operator()(in_stack_ffffffffffffff90,(uint32_t)in_stack_ffffffffffffff8c,
                              (uint32_t)in_stack_ffffffffffffff88);
      in_stack_ffffffffffffff80 =
           vec<4U,_float>::operator[]
                     ((vec<4U,_float> *)
                      CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (uint32_t)in_stack_ffffffffffffff7c);
      vec<4U,_float>::operator[]
                ((vec<4U,_float> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (uint32_t)in_stack_ffffffffffffff7c);
      in_stack_ffffffffffffff84 =
           vec<4U,_float>::operator[]
                     ((vec<4U,_float> *)
                      CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (uint32_t)in_stack_ffffffffffffff7c);
      vec<4U,_float>::operator[]
                ((vec<4U,_float> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (uint32_t)in_stack_ffffffffffffff7c);
      in_stack_ffffffffffffff88 =
           vec<4U,_float>::operator[]
                     ((vec<4U,_float> *)
                      CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (uint32_t)in_stack_ffffffffffffff7c);
      vec<4U,_float>::operator[]
                ((vec<4U,_float> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (uint32_t)in_stack_ffffffffffffff7c);
      in_stack_ffffffffffffff8c =
           vec<4U,_float>::operator[]
                     ((vec<4U,_float> *)
                      CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (uint32_t)in_stack_ffffffffffffff7c);
      vec<4U,_float>::operator[]
                ((vec<4U,_float> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (uint32_t)in_stack_ffffffffffffff7c);
      vec<4U,_float>::set((vec<4U,_float> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                          in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                          in_stack_ffffffffffffff80);
      local_30 = local_30 + 1;
    }
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void add_image(const imagef &src1, const imagef &src2, imagef &dst)
	{
		dst.resize(src1);

//#pragma omp parallel for
		for (int y = 0; y < (int)dst.get_height(); y++)
		{
			for (uint32_t x = 0; x < dst.get_width(); x++)
			{
				const vec4F &s1 = src1(x, y);
				const vec4F &s2 = src2(x, y);

				dst(x, y).set(s1[0] + s2[0], s1[1] + s2[1], s1[2] + s2[2], s1[3] + s2[3]);
			}
		}
	}